

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SizeTestInstance *this)

{
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  bool bVar2;
  int iVar3;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkQueue queue_00;
  Buffer *pBVar4;
  VkBuffer *pVVar5;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  VkDescriptorSetLayout descriptorSetLayout_00;
  undefined4 extraout_var_00;
  Handle<(vk::HandleType)16> *pHVar6;
  Handle<(vk::HandleType)14> *pHVar7;
  Handle<(vk::HandleType)24> *pHVar8;
  VkCommandBuffer_s **ppVVar9;
  Handle<(vk::HandleType)18> *pHVar10;
  Allocation *this_01;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  void *data_04;
  Vector<int,_3> *value;
  Vector<int,_3> *value_00;
  allocator<char> local_3c1;
  string local_3c0;
  undefined4 local_39c;
  string local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  IVec3 expectedSize;
  IVec3 resultSize;
  Allocation *bufferAlloc;
  Move<vk::VkCommandBuffer_s_*> local_2b8;
  RefData<vk::VkCommandBuffer_s_*> local_298;
  undefined1 local_278 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_238;
  undefined1 local_218 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_1c8;
  undefined1 local_1a8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_180;
  RefData<vk::Handle<(vk::HandleType)16>_> local_160;
  undefined1 local_140 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkDescriptorSet descriptorSet;
  VkDescriptorSetLayout descriptorSetLayout;
  allocator<char> local_f9;
  string local_f8;
  Move<vk::Handle<(vk::HandleType)14>_> local_d8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_b8;
  undefined1 local_98 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  undefined1 local_70 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SizeTestInstance *this_local;
  undefined4 extraout_var;
  
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  shaderWriteBarrier.size._4_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pBVar4 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->m_resultBuffer).
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  pVVar5 = image::Buffer::get(pBVar4);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar5->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_70,0x40,0x2000,
             (VkBuffer)
             shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             0,this->m_resultBufferSizeBytes);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"comp",&local_f9);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_f8);
  ::vk::createShaderModule(&local_d8,deviceInterface,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)&local_d8);
  data.deleter.m_deviceIface._0_4_ = (int)local_b8.deleter.m_deviceIface;
  data.object.m_internal = local_b8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_b8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_b8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_98,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  descriptorSetLayout_00.m_internal._0_4_ = (*(this->super_TestInstance)._vptr_TestInstance[3])();
  descriptorSetLayout_00.m_internal._4_4_ = extraout_var;
  iVar3 = (*(this->super_TestInstance)._vptr_TestInstance[4])();
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(extraout_var_00,iVar3);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)descriptorSetLayout_00.m_internal;
  makePipelineLayout(&local_180,deviceInterface,device_00,descriptorSetLayout_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_160,(Move *)&local_180);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_160.deleter.m_deviceIface;
  data_00.object.m_internal = local_160.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_160.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_160.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_160.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_160.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_140,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_180);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_140);
  pipelineLayout_00.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_98);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar7->m_internal;
  makeComputePipeline(&local_1e8,deviceInterface,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1c8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1c8.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_1c8.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1a8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1e8);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,deviceInterface
             ,device_00,2,shaderWriteBarrier.size._4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_238,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_238.deleter.m_deviceIface;
  data_02.object.m_internal = local_238.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_238.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_238.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_238.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_238.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_218,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_218);
  ::vk::allocateCommandBuffer
            (&local_2b8,deviceInterface,device_00,(VkCommandPool)pHVar8->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_298,(Move *)&local_2b8);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_298.deleter.m_deviceIface;
  data_03.object = local_298.object;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_298.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_298.deleter.m_device;
  data_03.deleter.m_pool.m_internal._0_4_ = (int)local_298.deleter.m_pool.m_internal;
  data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_298.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_278,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_2b8);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  beginCommandBuffer(deviceInterface,*ppVVar9);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  pVVar1 = *ppVVar9;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_1a8);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,pVVar1,1,pHVar10->m_internal);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  pVVar1 = *ppVVar9;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_140);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,pVVar1,1,pHVar6->m_internal,0,1,
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,0,0);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,*ppVVar9);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])(deviceInterface,*ppVVar9,1,1);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,*ppVVar9,0x800,0x4000,0,0,0,1,local_70,0,0);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  endCommandBuffer(deviceInterface,*ppVVar9);
  ppVVar9 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  submitCommandsAndWait(deviceInterface,device_00,queue_00,*ppVVar9);
  pBVar4 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->m_resultBuffer).
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  this_01 = image::Buffer::getAllocation(pBVar4);
  memory = ::vk::Allocation::getMemory(this_01);
  offset = ::vk::Allocation::getOffset(this_01);
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device_00,memory,offset,this->m_resultBufferSizeBytes);
  data_04 = ::vk::Allocation::getHostPtr(this_01);
  readIVec3((anon_unknown_0 *)(expectedSize.m_data + 1),data_04);
  getExpectedImageSizeResult((anon_unknown_0 *)local_2f8,&this->m_texture);
  bVar2 = tcu::Vector<int,_3>::operator!=
                    ((Vector<int,_3> *)(expectedSize.m_data + 1),(Vector<int,_3> *)local_2f8);
  if (bVar2) {
    de::toString<tcu::Vector<int,3>>(&local_378,(de *)local_2f8,value);
    std::operator+(&local_358,"Incorrect imageSize(): expected ",&local_378);
    std::operator+(&local_338,&local_358," but got ");
    de::toString<tcu::Vector<int,3>>(&local_398,(de *)(expectedSize.m_data + 1),value_00);
    std::operator+(&local_318,&local_338,&local_398);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Passed",&local_3c1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
  }
  local_39c = 1;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_278);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_218);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_140);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SizeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create memory barriers.

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
		m_resultBuffer->get(), 0ull, m_resultBufferSizeBytes);

	// Create the pipeline.

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const VkDescriptorSet descriptorSet = getDescriptorSet();

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

	commandBeforeCompute(*cmdBuffer);
	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Compare the result.

	const Allocation& bufferAlloc = m_resultBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAlloc.getMemory(), bufferAlloc.getOffset(), m_resultBufferSizeBytes);

	const tcu::IVec3 resultSize = readIVec3(bufferAlloc.getHostPtr());
	const tcu::IVec3 expectedSize = getExpectedImageSizeResult(m_texture);

	if (resultSize != expectedSize)
		return tcu::TestStatus::fail("Incorrect imageSize(): expected " + de::toString(expectedSize) + " but got " + de::toString(resultSize));
	else
		return tcu::TestStatus::pass("Passed");
}